

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::load(xml_iarchive *this,string *v)

{
  reference ppxVar1;
  char *pcVar2;
  string *v_local;
  xml_iarchive *this_local;
  
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  pcVar2 = rapidxml::xml_base<char>::value(&(*ppxVar1)->super_xml_base<char>);
  std::__cxx11::string::operator=((string *)v,pcVar2);
  return;
}

Assistant:

void load(std::string & v) const
    {
        v = stack_.top()->value();
    }